

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void __thiscall
dg::dda::MemorySSATransformation::collectAllDefinitions
          (MemorySSATransformation *this,Definitions *defs,RWBBlock *from,
          set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
          *visitedBlocks,bool escaping)

{
  byte bVar1;
  bool bVar2;
  RWBBlock *in_RCX;
  Definitions *in_RDX;
  MemorySSATransformation *in_RSI;
  byte in_R8B;
  pair<std::_Rb_tree_const_iterator<dg::dda::RWBBlock_*>,_bool> pVar3;
  Definitions tmpDefs;
  iterator E;
  iterator I;
  DefinitionsMap<dg::dda::RWNode> olddefinitions;
  RWBBlock *singlePred;
  ElemWithEdges<dg::dda::RWBBlock> *in_stack_fffffffffffffe98;
  Definitions *in_stack_fffffffffffffea0;
  DefSite *in_stack_fffffffffffffeb8;
  RWBBlock *in_stack_fffffffffffffec0;
  iterator in_stack_fffffffffffffec8;
  Definitions *in_stack_fffffffffffffed0;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_fffffffffffffee0;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_fffffffffffffee8;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_fffffffffffffef0;
  const_iterator in_stack_fffffffffffffef8;
  __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
  local_90 [8];
  RWBBlock *local_50;
  _Base_ptr local_48;
  byte local_40;
  _Base_ptr local_38;
  byte local_30;
  undefined1 in_stack_ffffffffffffffd7;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  pVar3 = std::
          set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
          ::insert((set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
                    *)in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
  local_48 = (_Base_ptr)pVar3.first._M_node;
  local_40 = pVar3.second;
  if (((local_40 ^ 0xff) & 1) == 0) {
    local_38 = local_48;
    local_30 = local_40;
    getBBlockDefinitions
              ((MemorySSATransformation *)in_stack_fffffffffffffec8._M_current,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    joinDefinitions(in_stack_fffffffffffffed0,(Definitions *)in_stack_fffffffffffffec8._M_current,
                    SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0));
    local_50 = ElemWithEdges<dg::dda::RWBBlock>::getSinglePredecessor
                         ((ElemWithEdges<dg::dda::RWBBlock> *)in_stack_fffffffffffffea0);
    if (local_50 == (RWBBlock *)0x0) {
      DefinitionsMap<dg::dda::RWNode>::DefinitionsMap
                ((DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffea0,
                 (DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffe98);
      local_90[0]._M_current =
           (RWBBlock **)ElemWithEdges<dg::dda::RWBBlock>::pred_begin(in_stack_fffffffffffffe98);
      ElemWithEdges<dg::dda::RWBBlock>::pred_end(in_stack_fffffffffffffe98);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                                 *)in_stack_fffffffffffffea0,
                                (__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                                 *)in_stack_fffffffffffffe98), bVar2) {
        Definitions::Definitions(in_stack_fffffffffffffea0);
        DefinitionsMap<dg::dda::RWNode>::operator=
                  ((DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffea0,
                   (DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffe98);
        __gnu_cxx::
        __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
        ::operator*(local_90);
        collectAllDefinitions
                  (in_RSI,in_RDX,in_RCX,
                   (set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
                    *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),(bool)in_stack_ffffffffffffffd7);
        DefinitionsMap<dg::dda::RWNode>::add
                  ((DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffed0,
                   (DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffec8._M_current);
        in_stack_fffffffffffffea0 =
             (Definitions *)&(in_RSI->super_DataDependenceAnalysisImpl).field_0x78;
        in_stack_fffffffffffffec8 =
             std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                       ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                        in_stack_fffffffffffffe98);
        __gnu_cxx::
        __normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
        ::__normal_iterator<dg::dda::RWNode**>
                  ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                    *)in_stack_fffffffffffffea0,
                   (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                    *)in_stack_fffffffffffffe98);
        std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                  ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                   in_stack_fffffffffffffe98);
        std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                  ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                   in_stack_fffffffffffffe98);
        std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
        insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>,void>
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8);
        Definitions::~Definitions(in_stack_fffffffffffffea0);
        __gnu_cxx::
        __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
        ::operator++(local_90);
      }
      DefinitionsMap<dg::dda::RWNode>::~DefinitionsMap((DefinitionsMap<dg::dda::RWNode> *)0x1751ba);
    }
    else {
      collectAllDefinitions
                (in_RSI,in_RDX,in_RCX,
                 (set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
                  *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),(bool)in_stack_ffffffffffffffd7);
    }
  }
  return;
}

Assistant:

void MemorySSATransformation::collectAllDefinitions(
        Definitions &defs, RWBBlock *from, std::set<RWBBlock *> &visitedBlocks,
        bool escaping) {
    assert(from);

    if (!visitedBlocks.insert(from).second) {
        return; // we already visited this block
    }

    // get the definitions from this block
    joinDefinitions(getBBlockDefinitions(from), defs, escaping);

    // recur into predecessors
    if (auto *singlePred = from->getSinglePredecessor()) {
        collectAllDefinitions(defs, singlePred, visitedBlocks, escaping);
    } else {
        auto olddefinitions = defs.definitions;
        for (auto I = from->pred_begin(), E = from->pred_end(); I != E; ++I) {
            Definitions tmpDefs;
            tmpDefs.definitions = olddefinitions;
            collectAllDefinitions(tmpDefs, *I, visitedBlocks, escaping);
            defs.definitions.add(tmpDefs.definitions);
            defs.unknownWrites.insert(defs.unknownWrites.end(),
                                      tmpDefs.unknownWrites.begin(),
                                      tmpDefs.unknownWrites.end());
        }
    }
}